

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveDictionary<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator>::
PrimitiveDictionary(PrimitiveDictionary<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator>
                    *this,Allocator *allocator_p,idx_t maximum_size_p,
                   idx_t maximum_target_capacity_p)

{
  Allocator *pAVar1;
  _Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false> _Var2;
  data_ptr_t buffer;
  reallocate_function_ptr_t p_Var3;
  free_function_ptr_t in_RCX;
  free_function_ptr_t in_RDX;
  allocate_function_ptr_t in_RSI;
  Allocator *in_RDI;
  idx_t i;
  Allocator *capacity;
  MemoryStream *this_00;
  PrivateAllocatorData *local_38;
  
  in_RDI->allocate_function = in_RSI;
  in_RDI->free_function = in_RDX;
  in_RDI->reallocate_function = (reallocate_function_ptr_t)0x0;
  _Var2._M_head_impl = (PrivateAllocatorData *)NextPowerOfTwo((uint64_t)in_RDX);
  (in_RDI->private_data).
  super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
  .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>._M_head_impl = _Var2._M_head_impl;
  in_RDI[1].allocate_function =
       (allocate_function_ptr_t)
       ((long)((in_RDI->private_data).
               super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
               .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>._M_head_impl +
              0xffffffffffffffff) + 0x17);
  in_RDI[1].free_function = in_RCX;
  this_00 = (MemoryStream *)&in_RDI[1].reallocate_function;
  Allocator::Allocate(in_RDI,(idx_t)this_00);
  Allocator::Allocate(in_RDI,(idx_t)this_00);
  capacity = in_RDI + 3;
  pAVar1 = in_RDI + 2;
  buffer = AllocatedData::get((AllocatedData *)&pAVar1->free_function);
  AllocatedData::GetSize((AllocatedData *)&pAVar1->free_function);
  MemoryStream::MemoryStream(this_00,buffer,(idx_t)capacity);
  p_Var3 = (reallocate_function_ptr_t)
           AllocatedData::get((AllocatedData *)&in_RDI[1].reallocate_function);
  in_RDI[4].reallocate_function = p_Var3;
  *(undefined1 *)
   &in_RDI[4].private_data.
    super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
    .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>._M_head_impl = 0;
  for (local_38 = (PrivateAllocatorData *)0x0;
      local_38 <
      (in_RDI->private_data).
      super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
      .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>._M_head_impl;
      local_38 = (PrivateAllocatorData *)((long)&local_38->_vptr_PrivateAllocatorData + 1)) {
    *(undefined4 *)(in_RDI[4].reallocate_function + (long)local_38 * 0x10 + 8) = 0xffffffff;
  }
  return;
}

Assistant:

PrimitiveDictionary(Allocator &allocator_p, idx_t maximum_size_p, idx_t maximum_target_capacity_p)
	    : allocator(allocator_p), maximum_size(maximum_size_p), size(0),
	      capacity(NextPowerOfTwo(maximum_size * LOAD_FACTOR)), capacity_mask(capacity - 1),
	      maximum_target_capacity(maximum_target_capacity_p),
	      allocated_dictionary(allocator.Allocate(capacity * sizeof(primitive_dictionary_entry_t))),
	      allocated_target(allocator.Allocate(std::is_same<TGT, string_t>::value
	                                              ? MinValue(INITIAL_TARGET_CAPACITY, maximum_target_capacity)
	                                              : capacity * sizeof(TGT))),
	      target_stream(allocated_target.get(), allocated_target.GetSize()),
	      dictionary(reinterpret_cast<primitive_dictionary_entry_t *>(allocated_dictionary.get())), full(false) {
		// Initialize empty
		for (idx_t i = 0; i < capacity; i++) {
			dictionary[i].index = INVALID_INDEX;
		}
	}